

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCase::LongStressCase
          (LongStressCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,
          int maxTexMemoryUsageBytes,int maxBufMemoryUsageBytes,int numDrawCallsPerIteration,
          int numTrianglesPerDrawCall,
          vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
          *programContexts,FeatureProbabilities *probabilities,deUint32 indexBufferUsage,
          deUint32 attrBufferUsage,int redundantBufferFactor,bool showDebugInfo)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  bool bVar16;
  int iVar17;
  ContextType ctxType;
  deUint32 dVar18;
  uint uVar19;
  int iVar20;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__LongStressCase_01e6da10
  ;
  this->m_renderCtx = renderCtx;
  this->m_maxTexMemoryUsageBytes = maxTexMemoryUsageBytes;
  this->m_maxBufMemoryUsageBytes = maxBufMemoryUsageBytes;
  this->m_numDrawCallsPerIteration = numDrawCallsPerIteration;
  this->m_numTrianglesPerDrawCall = numTrianglesPerDrawCall;
  this->m_numVerticesPerDrawCall = numTrianglesPerDrawCall + 2;
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&this->m_programContexts,programContexts);
  fVar12 = probabilities->rebuildProgram;
  fVar13 = probabilities->reuploadTexture;
  fVar14 = probabilities->reuploadBuffer;
  fVar15 = probabilities->reuploadWithTexImage;
  fVar8 = probabilities->reuploadWithBufferData;
  fVar9 = probabilities->deleteTexture;
  fVar10 = probabilities->deleteBuffer;
  fVar11 = probabilities->wastefulTextureMemoryUsage;
  fVar4 = probabilities->wastefulBufferMemoryUsage;
  fVar5 = probabilities->clientMemoryAttributeData;
  fVar6 = probabilities->clientMemoryIndexData;
  fVar7 = probabilities->randomBufferUploadTarget;
  fVar1 = probabilities->randomBufferUsage;
  fVar2 = probabilities->useDrawArrays;
  fVar3 = probabilities->separateAttributeBuffers;
  (this->m_probabilities).randomBufferUploadTarget = probabilities->randomBufferUploadTarget;
  (this->m_probabilities).randomBufferUsage = fVar1;
  (this->m_probabilities).useDrawArrays = fVar2;
  (this->m_probabilities).separateAttributeBuffers = fVar3;
  (this->m_probabilities).wastefulBufferMemoryUsage = fVar4;
  (this->m_probabilities).clientMemoryAttributeData = fVar5;
  (this->m_probabilities).clientMemoryIndexData = fVar6;
  (this->m_probabilities).randomBufferUploadTarget = fVar7;
  (this->m_probabilities).reuploadWithBufferData = fVar8;
  (this->m_probabilities).deleteTexture = fVar9;
  (this->m_probabilities).deleteBuffer = fVar10;
  (this->m_probabilities).wastefulTextureMemoryUsage = fVar11;
  (this->m_probabilities).rebuildProgram = fVar12;
  (this->m_probabilities).reuploadTexture = fVar13;
  (this->m_probabilities).reuploadBuffer = fVar14;
  (this->m_probabilities).reuploadWithTexImage = fVar15;
  this->m_indexBufferUsage = indexBufferUsage;
  this->m_attrBufferUsage = attrBufferUsage;
  this->m_redundantBufferFactor = redundantBufferFactor;
  this->m_showDebugInfo = showDebugInfo;
  iVar17 = tcu::CommandLine::getTestIterationCount(testCtx->m_cmdLine);
  iVar20 = 5;
  if (iVar17 != 0) {
    iVar20 = iVar17;
  }
  this->m_numIterations = iVar20;
  ctxType.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  bVar16 = glu::contextSupports(ctxType,(ApiType)0x3);
  this->m_isGLES3 = bVar16;
  this->m_currentIteration = 0;
  *(undefined4 *)&this->m_startTimeSeconds = 0xffffffff;
  *(undefined4 *)((long)&this->m_startTimeSeconds + 4) = 0xffffffff;
  *(undefined4 *)&this->m_lastLogTime = 0xffffffff;
  *(undefined4 *)((long)&this->m_lastLogTime + 4) = 0xffffffff;
  this->m_lastLogIteration = 0;
  this->m_currentLogEntryNdx = 0;
  dVar18 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar19 = tcu::CommandLine::getBaseSeed(testCtx->m_cmdLine);
  deRandom_init(&(this->m_rnd).m_rnd,uVar19 ^ dVar18);
  *(undefined1 (*) [16])
   &(this->m_programResources).
    super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_programResources).
  super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_programResources).
  super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_textures = (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *)0x0;
  (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->m_programs = (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *)0x0;
  this->m_buffers = (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *)0x0;
  return;
}

Assistant:

LongStressCase::LongStressCase (tcu::TestContext&				testCtx,
								const glu::RenderContext&		renderCtx,
								const char* const				name,
								const char* const				desc,
								const int						maxTexMemoryUsageBytes,
								const int						maxBufMemoryUsageBytes,
								const int						numDrawCallsPerIteration,
								const int						numTrianglesPerDrawCall,
								const vector<ProgramContext>&	programContexts,
								const FeatureProbabilities&		probabilities,
								const deUint32					indexBufferUsage,
								const deUint32					attrBufferUsage,
								const int						redundantBufferFactor,
								const bool						showDebugInfo)
	: tcu::TestCase					(testCtx, name, desc)
	, m_renderCtx					(renderCtx)
	, m_maxTexMemoryUsageBytes		(maxTexMemoryUsageBytes)
	, m_maxBufMemoryUsageBytes		(maxBufMemoryUsageBytes)
	, m_numDrawCallsPerIteration	(numDrawCallsPerIteration)
	, m_numTrianglesPerDrawCall		(numTrianglesPerDrawCall)
	, m_numVerticesPerDrawCall		(numTrianglesPerDrawCall+2) // \note Triangle strips are used.
	, m_programContexts				(programContexts)
	, m_probabilities				(probabilities)
	, m_indexBufferUsage			(indexBufferUsage)
	, m_attrBufferUsage				(attrBufferUsage)
	, m_redundantBufferFactor		(redundantBufferFactor)
	, m_showDebugInfo				(showDebugInfo)
	, m_numIterations				(getNumIterations(testCtx, 5))
	, m_isGLES3						(contextSupports(renderCtx.getType(), glu::ApiType::es(3,0)))
	, m_currentIteration			(0)
	, m_startTimeSeconds			((deUint64)-1)
	, m_lastLogTime					((deUint64)-1)
	, m_lastLogIteration			(0)
	, m_currentLogEntryNdx			(0)
	, m_rnd							(deStringHash(getName()) ^ testCtx.getCommandLine().getBaseSeed())
	, m_programs					(DE_NULL)
	, m_buffers						(DE_NULL)
	, m_textures					(DE_NULL)
	, m_debugInfoRenderer			(DE_NULL)
{
	DE_ASSERT(m_numVerticesPerDrawCall <= (int)std::numeric_limits<deUint16>::max()+1); // \note Vertices are referred to with 16-bit indices.
	DE_ASSERT(m_redundantBufferFactor > 0);
}